

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::MatchPrintAndExplain<std::__cxx11::string_const,std::__cxx11::string_const&>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *matcher,MatchResultListener *listener)

{
  MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *pMVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  StringMatchResultListener inner_listener;
  string sStack_1f8;
  string local_1d8;
  StringMatchResultListener local_1b8;
  
  if (listener->stream_ != (ostream *)0x0) {
    StringMatchResultListener::StringMatchResultListener(&local_1b8);
    pMVar1 = (matcher->
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             ).impl_.value_;
    iVar3 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar1,value,&local_1b8);
    PrintStringTo((string *)value,(ostream *)listener->stream_);
    GetTypeName<std::__cxx11::string_const>();
    bVar2 = IsReadableTypeName(&sStack_1f8);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)listener->stream_," (of type ");
      poVar4 = std::operator<<(poVar4,(string *)&sStack_1f8);
      std::operator<<(poVar4,")");
    }
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d8,listener->stream_);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&sStack_1f8);
    StringMatchResultListener::~StringMatchResultListener(&local_1b8);
    return SUB41(iVar3,0);
  }
  bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::Matches(&matcher->
                     super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    ,value);
  return bVar2;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}